

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O0

void cmd_init(void)

{
  cmd_info *pcVar1;
  wchar_t wVar2;
  cmd_info **ppcVar3;
  wchar_t local_28;
  wchar_t kidx;
  cmd_info *commands;
  size_t j;
  size_t i;
  
  memset(converted_list,0,0x1000);
  if (nested_lists != (cmd_info ***)0x0) {
    if (n_nested < L'\0') {
      __assert_fail("n_nested >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                    ,0x17a,"void cmd_init(void)");
    }
    for (commands = (cmd_info *)0x0; commands < (cmd_info *)(long)n_nested;
        commands = (cmd_info *)((long)&commands->desc + 1)) {
      mem_free(nested_lists[(long)commands]);
    }
    nested_lists = (cmd_info ***)0x0;
  }
  n_nested = L'\0';
  for (commands = (cmd_info *)0x0; commands < (cmd_info *)0x10;
      commands = (cmd_info *)((long)&commands->desc + 1)) {
    if (n_nested < cmds_all[(long)commands].keymap) {
      local_28 = cmds_all[(long)commands].keymap;
    }
    else {
      local_28 = n_nested;
    }
    n_nested = local_28;
  }
  if (L'\0' < n_nested) {
    nested_lists = (cmd_info ***)mem_zalloc((long)n_nested << 3);
    for (commands = (cmd_info *)0x0; commands < (cmd_info *)(long)n_nested;
        commands = (cmd_info *)((long)&commands->desc + 1)) {
      ppcVar3 = (cmd_info **)mem_zalloc(0x800);
      nested_lists[(long)commands] = ppcVar3;
    }
  }
  commands = (cmd_info *)0x0;
  do {
    if ((cmd_info *)0xf < commands) {
      return;
    }
    pcVar1 = cmds_all[(long)commands].list;
    if (cmds_all[(long)commands].keymap == 0) {
      for (j = 0; j < cmds_all[(long)commands].len; j = j + 1) {
        if (pcVar1[j].key[1] == 0) {
          pcVar1[j].key[1] = pcVar1[j].key[0];
        }
        if ((pcVar1[j].key[0] != 0) && (pcVar1[j].key[1] != 0)) {
          converted_list[0][pcVar1[j].key[0]] = pcVar1 + j;
          converted_list[1][pcVar1[j].key[1]] = pcVar1 + j;
        }
      }
    }
    else if (0 < cmds_all[(long)commands].keymap) {
      wVar2 = cmds_all[(long)commands].keymap + L'\xffffffff';
      if (n_nested <= wVar2) {
        __assert_fail("kidx < n_nested",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                      ,0x1a4,"void cmd_init(void)");
      }
      for (j = 0; j < cmds_all[(long)commands].len; j = j + 1) {
        pcVar1[j].key[1] = pcVar1[j].key[0];
        if (nested_lists[wVar2][pcVar1[j].key[0]] != (cmd_info *)0x0) {
          __assert_fail("!nested_lists[kidx][commands[i].key[0]]",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                        ,0x1b0,"void cmd_init(void)");
        }
        nested_lists[wVar2][pcVar1[j].key[0]] = pcVar1 + j;
      }
    }
    commands = (cmd_info *)((long)&commands->desc + 1);
  } while( true );
}

Assistant:

void cmd_init(void)
{
	size_t i, j;

	memset(converted_list, 0, sizeof(converted_list));

	/* Set up storage for the nested command lists */
	if (nested_lists != NULL) {
		assert(n_nested >= 0);
		for (j = 0; j < (size_t)n_nested; j++) {
			mem_free(nested_lists[j]);
		}
		nested_lists = NULL;
	}
	n_nested = 0;
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++) {
		n_nested = MAX(n_nested, cmds_all[j].keymap);
	}
	if (n_nested > 0) {
		nested_lists = mem_zalloc(n_nested * sizeof(*nested_lists));
		for (j = 0; j < (size_t)n_nested; j++) {
			nested_lists[j] = mem_zalloc((UCHAR_MAX + 1) *
				sizeof(*(nested_lists[j])));
		}
	}

	/* Go through all generic commands (-1 for NULL end entry) */
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++)
	{
		struct cmd_info *commands = cmds_all[j].list;

		/* Fill everything in */
		if (cmds_all[j].keymap == 0) {
			for (i = 0; i < cmds_all[j].len; i++) {
				/* If a roguelike key isn't set, use default */
				if (!commands[i].key[1])
					commands[i].key[1] = commands[i].key[0];

				/* Skip entries that don't have a valid key. */
				if (!commands[i].key[0] || !commands[i].key[1])
					continue;

				converted_list[0][commands[i].key[0]] =
					&commands[i];
				converted_list[1][commands[i].key[1]] =
					&commands[i];
			}
		} else if (cmds_all[j].keymap > 0) {
			int kidx = cmds_all[j].keymap - 1;

			assert(kidx < n_nested);
			for (i = 0; i < cmds_all[j].len; i++) {
				/*
				 * Nested commands don't go through a keymap;
				 * use the default for the roguelike key.
				 */
				commands[i].key[1] = commands[i].key[0];

				/*
				 * Check for duplicated keys in the same
				 * command set.
				 */
				assert(!nested_lists[kidx][commands[i].key[0]]);

				nested_lists[kidx][commands[i].key[0]] =
					&commands[i];
			}
		}
	}
}